

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

_Bool change_panel(wchar_t dir)

{
  term_conflict2 *t_00;
  _Bool _Var1;
  int iVar2;
  int local_38;
  term_conflict2 *t;
  wchar_t wy;
  wchar_t wx;
  wchar_t screen_wid;
  wchar_t screen_hgt;
  wchar_t j;
  _Bool changed;
  wchar_t dir_local;
  
  screen_hgt._3_1_ = false;
  for (screen_wid = L'\0'; screen_wid < L'\b'; screen_wid = screen_wid + L'\x01') {
    t_00 = (term_conflict2 *)angband_term[screen_wid];
    if ((t_00 != (term_conflict2 *)0x0) &&
       ((screen_wid < L'\x01' || ((window_flag[screen_wid] & 0x80) != 0)))) {
      if (screen_wid == L'\0') {
        iVar2 = ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode])
                / (int)(uint)tile_height;
        local_38 = ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
      }
      else {
        iVar2 = t_00->hgt / (int)(uint)tile_height;
        local_38 = t_00->wid / (int)(uint)tile_width;
      }
      _Var1 = modify_panel(t_00,t_00->offset_y + (ddy[dir] * iVar2) / 2,
                           t_00->offset_x + (ddx[dir] * local_38) / 2);
      if (_Var1) {
        screen_hgt._3_1_ = true;
      }
    }
  }
  return screen_hgt._3_1_;
}

Assistant:

bool change_panel(int dir)
{
	bool changed = false;
	int j;

	/* Scan windows */
	for (j = 0; j < ANGBAND_TERM_MAX; j++) {
		int screen_hgt, screen_wid;
		int wx, wy;

		term *t = angband_term[j];

		/* No window */
		if (!t) continue;

		/* No relevant flags */
		if ((j > 0) && !(window_flag[j] & PW_OVERHEAD)) continue;

		screen_hgt = (j == 0) ? SCREEN_HGT : t->hgt / tile_height;
		screen_wid = (j == 0) ? SCREEN_WID : t->wid / tile_width;

		/* Shift by half a panel */
		wy = t->offset_y + ddy[dir] * screen_hgt / 2;
		wx = t->offset_x + ddx[dir] * screen_wid / 2;

		/* Use "modify_panel" */
		if (modify_panel(t, wy, wx)) changed = true;
	}

	return (changed);
}